

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void LoadBytes(AES_state *s,uchar *data16)

{
  long lVar1;
  int iVar2;
  int r;
  int iVar3;
  byte bVar4;
  int i;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  do {
    iVar3 = 0;
    do {
      bVar4 = *data16;
      lVar5 = 0;
      do {
        s->slice[lVar5] =
             s->slice[lVar5] | (ushort)(bVar4 & 1) << ((char)iVar2 + (char)iVar3 * '\x04' & 0x1fU);
        bVar4 = bVar4 >> 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      data16 = data16 + 1;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void LoadBytes(AES_state *s, const unsigned char* data16) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(s, *(data16++), r, c);
        }
    }
}